

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

bool __thiscall
dg::vr::RelationsAnalyzer::processPhi
          (RelationsAnalyzer *this,ValueRelations *newGraph,VRAssumeBool *assume)

{
  bool bVar1;
  VRAssumeBool *this_00;
  size_type sVar2;
  VRInstruction *this_01;
  ret_type pIVar3;
  Instruction *ptr;
  VRAssumeBool *in_RDX;
  VRCodeGraph *in_RDI;
  VRLocation *source;
  VRAssumeBool tmp;
  bool result;
  ICmpInst *icmp;
  VRInstruction *inst;
  ValueRelations *in_stack_00000080;
  vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_> *sources;
  PHINode *phi;
  Value *v;
  VRAssumeBool *in_stack_ffffffffffffff70;
  ValueRelations *in_stack_ffffffffffffff78;
  ValueRelations *in_stack_ffffffffffffff80;
  RelationsAnalyzer *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffffa8;
  undefined1 bval;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint uVar4;
  StructureAnalyzer *in_stack_ffffffffffffffb8;
  byte local_1;
  
  bval = (undefined1)((ulong)in_stack_ffffffffffffffa8 >> 0x38);
  VRAssume::getValue(&in_RDX->super_VRAssume);
  this_00 = (VRAssumeBool *)llvm::cast<llvm::PHINode,llvm::Value_const>((Value *)0x1d0071);
  v = *(Value **)&in_RDI->field_0x40;
  VRAssumeBool::getAssumption(in_RDX);
  StructureAnalyzer::possibleSources
            (in_stack_ffffffffffffffb8,
             (PHINode *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),(bool)bval);
  sVar2 = std::vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>::size
                    ((vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_> *)
                     &stack0xffffffffffffffb8);
  if (sVar2 == 1) {
    std::vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>::operator[]
              ((vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_> *)
               &stack0xffffffffffffffb8,0);
    this_01 = (VRInstruction *)
              std::unique_ptr<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_>::get
                        ((unique_ptr<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_> *)0x1d0110);
    VRInstruction::getInstruction(this_01);
    pIVar3 = llvm::dyn_cast<llvm::ICmpInst,llvm::Instruction_const>((Instruction *)in_RDI);
    if (pIVar3 != (ret_type)0x0) {
      ptr = VRInstruction::getInstruction(this_01);
      VRAssumeBool::getAssumption(in_RDX);
      VRAssumeBool::VRAssumeBool(this_00,v,SUB81((ulong)in_RDI >> 0x38,0));
      VRCodeGraph::getVRLocation(in_RDI,ptr);
      bVar1 = processICMP(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                          in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      if (!bVar1) {
        local_1 = 0;
      }
      uVar4 = (uint)!bVar1;
      VRAssumeBool::~VRAssumeBool((VRAssumeBool *)0x1d01c9);
      if (uVar4 != 0) goto LAB_001d022f;
    }
    std::vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>::operator[]
              ((vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_> *)
               &stack0xffffffffffffffb8,0);
    ValueRelations::merge((ValueRelations *)sources,in_stack_00000080,(Relations)phi);
    local_1 = 1;
  }
  else {
    local_1 = 1;
  }
LAB_001d022f:
  std::vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>::~vector
            ((vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_> *)this_00);
  return (bool)(local_1 & 1);
}

Assistant:

bool RelationsAnalyzer::processPhi(ValueRelations &newGraph,
                                   VRAssumeBool *assume) {
    const llvm::PHINode *phi = llvm::cast<llvm::PHINode>(assume->getValue());
    const auto &sources =
            structure.possibleSources(phi, assume->getAssumption());
    if (sources.size() != 1)
        return true;

    VRInstruction *inst = static_cast<VRInstruction *>(sources[0]->op.get());
    const auto *icmp = llvm::dyn_cast<llvm::ICmpInst>(inst->getInstruction());

    bool result;
    if (icmp) {
        VRAssumeBool tmp{inst->getInstruction(), assume->getAssumption()};
        result = processICMP(codeGraph.getVRLocation(icmp).relations, newGraph,
                             &tmp);
        if (!result)
            return false;
    }

    VRLocation &source = *sources[0]->target;
    result = newGraph.merge(source.relations);
    assert(result);
    return true;
}